

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlACatalogResolveURI(xmlCatalogPtr catal,xmlChar *URI)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  
  if (catal == (xmlCatalogPtr)0x0 || URI == (xmlChar *)0x0) {
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    if (xmlDebugCatalogs != 0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Resolve URI %s\n",URI);
    }
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar4 = xmlCatalogListXMLResolveURI(catal->xml,URI);
      pxVar5 = (xmlChar *)0x0;
      if (pxVar4 != (xmlChar *)0xffffffffffffffff) {
        pxVar5 = pxVar4;
      }
    }
    else {
      pxVar4 = xmlCatalogSGMLResolve(catal,(xmlChar *)0x0,URI);
      pxVar5 = (xmlChar *)0x0;
      if (pxVar4 != (xmlChar *)0x0) {
        pxVar5 = xmlStrdup(pxVar4);
        return pxVar5;
      }
    }
  }
  return pxVar5;
}

Assistant:

xmlChar *
xmlACatalogResolveURI(xmlCatalogPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;

    if ((URI == NULL) || (catal == NULL))
	return(NULL);

    if (xmlDebugCatalogs)
	xmlGenericError(xmlGenericErrorContext,
		"Resolve URI %s\n", URI);

    if (catal->type == XML_XML_CATALOG_TYPE) {
	ret = xmlCatalogListXMLResolveURI(catal->xml, URI);
	if (ret == XML_CATAL_BREAK)
	    ret = NULL;
    } else {
	const xmlChar *sgml;

	sgml = xmlCatalogSGMLResolve(catal, NULL, URI);
	if (sgml != NULL)
            ret = xmlStrdup(sgml);
    }
    return(ret);
}